

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

bool google::protobuf::CaseEqual(StringPiece s1,StringPiece s2)

{
  char cVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  
  lVar3 = s1.length_;
  if (lVar3 != s2.length_) {
    return false;
  }
  if (lVar3 != 0) {
    lVar2 = 0;
    do {
      cVar1 = s1.ptr_[lVar2];
      cVar4 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar4 = cVar1;
      }
      cVar1 = s2.ptr_[lVar2];
      cVar5 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar5 = cVar1;
      }
    } while ((cVar4 == cVar5) && (bVar6 = lVar3 + -1 != lVar2, lVar2 = lVar2 + 1, bVar6));
    return cVar4 == cVar5;
  }
  return true;
}

Assistant:

inline bool CaseEqual(StringPiece s1, StringPiece s2) {
  if (s1.size() != s2.size()) return false;
  return memcasecmp(s1.data(), s2.data(), s1.size()) == 0;
}